

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_positive_int<unsigned_long>(string *text,unsigned_long *value_p)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  ulong *in_RSI;
  int digit;
  uchar c;
  char *end;
  char *start;
  unsigned_long vmax_over_base;
  unsigned_long vmax;
  unsigned_long value;
  int base;
  byte *local_40;
  ulong local_28;
  
  local_28 = 0;
  local_40 = (byte *)std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::size();
  pbVar3 = local_40 + lVar2;
  while( true ) {
    if (pbVar3 <= local_40) {
      *in_RSI = local_28;
      return true;
    }
    iVar1 = *local_40 - 0x30;
    if ((9 < iVar1) || (iVar1 < 0)) {
      *in_RSI = local_28;
      return false;
    }
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT816(10),0) < local_28) {
      *in_RSI = 0xffffffffffffffff;
      return false;
    }
    if (-(long)iVar1 - 1U < local_28 * 10) break;
    local_28 = (long)iVar1 + local_28 * 10;
    local_40 = local_40 + 1;
  }
  *in_RSI = 0xffffffffffffffff;
  return false;
}

Assistant:

bool safe_parse_positive_int(std::string text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(vmax >= base);
  const IntType vmax_over_base = vmax / base;
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}